

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O0

void warn_all_untested(void)

{
  int iVar1;
  ENGINE *e;
  EVP_MD *dgst;
  long lVar2;
  OSSL_PROVIDER *prov;
  int k;
  int n;
  int *nids;
  ENGINE_DIGESTS_PTR fn_c;
  ENGINE *eng;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  void *in_stack_ffffffffffffffe8;
  
  iVar1 = engine_is_available((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  if (iVar1 != 0) {
    e = ENGINE_by_id("gost");
    if (e == (ENGINE *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("eng = ENGINE_by_id(\"gost\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a3);
    }
    iVar1 = ENGINE_init(e);
    if (iVar1 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("ENGINE_init(eng)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a4);
    }
    dgst = (EVP_MD *)ENGINE_get_digests(e);
    if (dgst == (EVP_MD *)0x0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("fn_c = ENGINE_get_digests(eng)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3a7);
    }
    iVar1 = (*(code *)dgst)(e,0,&stack0xffffffffffffffe8,0);
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      ENGINE_get_digest(e,*(int *)((long)in_stack_ffffffffffffffe8 + (long)iVar3 * 4));
      warn_if_untested(dgst,in_stack_ffffffffffffffe8);
    }
    ENGINE_finish(e);
    ENGINE_free(e);
  }
  iVar1 = OSSL_PROVIDER_available(0,"gostprov");
  if (iVar1 != 0) {
    lVar2 = OSSL_PROVIDER_load(0,"gostprov");
    if (lVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("prov = OSSL_PROVIDER_load(NULL, \"gostprov\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x3b3);
    }
    EVP_MD_do_all_provided(0,warn_if_untested,lVar2);
    OSSL_PROVIDER_unload(lVar2);
  }
  return;
}

Assistant:

void warn_all_untested(void)
{
    if (engine_is_available("gost")) {
        ENGINE *eng;

        T(eng = ENGINE_by_id("gost"));
        T(ENGINE_init(eng));

        ENGINE_DIGESTS_PTR fn_c;
        T(fn_c = ENGINE_get_digests(eng));
        const int *nids;
        int n, k;
        n = fn_c(eng, NULL, &nids, 0);
        for (k = 0; k < n; ++k)
            warn_if_untested(ENGINE_get_digest(eng, nids[k]), NULL);
        ENGINE_finish(eng);
        ENGINE_free(eng);
    }
    if (OSSL_PROVIDER_available(NULL, "gostprov")) {
        OSSL_PROVIDER *prov;

        T(prov = OSSL_PROVIDER_load(NULL, "gostprov"));
        EVP_MD_do_all_provided(NULL,
                               (void (*)(EVP_MD *, void *))warn_if_untested,
                               prov);

        OSSL_PROVIDER_unload(prov);
    }
}